

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  String result;
  String local_38;
  
  heapString(&local_38,3);
  sVar1 = local_38.content.size_;
  pcVar3 = (char *)local_38.content.size_;
  if ((char *)local_38.content.size_ != (char *)0x0) {
    pcVar3 = local_38.content.ptr;
  }
  pcVar3[2] = 'o';
  pcVar3[0] = 'f';
  pcVar3[1] = 'o';
  bVar4 = true;
  if ((char *)local_38.content.size_ == (char *)0x4) {
    iVar2 = bcmp(local_38.content.ptr,"foo",3);
    bVar4 = iVar2 != 0;
  }
  pcVar3 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar3,1,sVar1,sVar1,0);
  }
  if ((bool)(bVar4 & Debug::minSeverity < 3)) {
    heapString(&local_38,3);
    pcVar3 = (char *)local_38.content.size_;
    if ((char *)local_38.content.size_ != (char *)0x0) {
      pcVar3 = local_38.content.ptr;
    }
    pcVar3[2] = 'o';
    pcVar3[0] = 'f';
    pcVar3[1] = 'o';
    Debug::log<char_const(&)[52],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (kj::str(Stringable()))\", \"foo\", kj::str(Stringable())"
               ,(char (*) [52])"failed: expected (\"foo\") == (kj::str(Stringable()))",
               (char (*) [4])0x198388,&local_38);
    sVar1 = local_38.content.size_;
    pcVar3 = local_38.content.ptr;
    if (local_38.content.ptr != (char *)0x0) {
      local_38.content.ptr = (char *)0x0;
      local_38.content.size_ = 0;
      (**(local_38.content.disposer)->_vptr_ArrayDisposer)
                (local_38.content.disposer,pcVar3,1,sVar1,sVar1,0);
    }
  }
  return;
}

Assistant:

TEST(String, ToString) {
  EXPECT_EQ("foo", kj::str(Stringable()));
}